

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralPointConnection::~IfcStructuralPointConnection
          (IfcStructuralPointConnection *this)

{
  undefined8 *puVar1;
  long *plVar2;
  long lVar3;
  
  lVar3 = *(long *)(*(long *)&this->super_IfcStructuralConnection + -0x18);
  puVar1 = (undefined8 *)(&(this->super_IfcStructuralConnection).field_0x0 + lVar3);
  plVar2 = (long *)(&(this->super_IfcStructuralConnection).field_0xb8 + lVar3);
  plVar2[-0x17] = 0x91d468;
  plVar2[0x11] = 0x91d4e0;
  plVar2[-6] = 0x91d490;
  plVar2[-4] = 0x91d4b8;
  if ((long *)plVar2[-2] != plVar2) {
    operator_delete((long *)plVar2[-2],*plVar2 + 1);
  }
  *puVar1 = 0x91d580;
  puVar1[0x28] = 0x91d5a8;
  if ((long *)puVar1[0xc] != puVar1 + 0xe) {
    operator_delete((long *)puVar1[0xc],puVar1[0xe] + 1);
  }
  if ((long *)puVar1[7] != puVar1 + 9) {
    operator_delete((long *)puVar1[7],puVar1[9] + 1);
  }
  if ((long *)puVar1[2] != puVar1 + 4) {
    operator_delete((long *)puVar1[2],puVar1[4] + 1);
    return;
  }
  return;
}

Assistant:

IfcStructuralPointConnection() : Object("IfcStructuralPointConnection") {}